

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

uint32_t __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::append_to_codepoint
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,uint32_t cp,int c,error_code *ec)

{
  bool bVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  int in_EDX;
  int in_ESI;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_RDI;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *this_00;
  json_errc local_4;
  
  local_4 = in_ESI * 0x10;
  if ((in_EDX < 0x30) || (0x39 < in_EDX)) {
    if ((in_EDX < 0x61) || (0x66 < in_EDX)) {
      if ((in_EDX < 0x41) || (0x46 < in_EDX)) {
        this_00 = in_RDI;
        bVar1 = std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::operator()
                          (in_RDI,local_4,(ser_context *)CONCAT71(in_register_00000009,in_CL));
        *(bool *)((long)&in_RDI[3]._M_invoker + 3) = bVar1;
        if (((ulong)in_RDI[3]._M_invoker & 0x1000000) == 0) {
          std::error_code::operator=((error_code *)this_00,local_4);
        }
      }
      else {
        local_4 = in_EDX + -0x37 + local_4;
      }
    }
    else {
      local_4 = in_EDX + -0x57 + local_4;
    }
  }
  else {
    local_4 = in_EDX + -0x30 + local_4;
  }
  return local_4;
}

Assistant:

uint32_t append_to_codepoint(uint32_t cp, int c, std::error_code& ec)
    {
        cp *= 16;
        if (c >= '0'  &&  c <= '9')
        {
            cp += c - '0';
        }
        else if (c >= 'a'  &&  c <= 'f')
        {
            cp += c - 'a' + 10;
        }
        else if (c >= 'A'  &&  c <= 'F')
        {
            cp += c - 'A' + 10;
        }
        else
        {
            more_ = err_handler_(json_errc::invalid_unicode_escape_sequence, *this);
            if (!more_)
            {
                ec = json_errc::invalid_unicode_escape_sequence;
                return cp;
            }
        }
        return cp;
    }